

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_max_limits(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int vnum;
  OBJ_INDEX_DATA *pOVar3;
  char *txt;
  char arg [4608];
  char local_1218 [4616];
  
  one_argument(argument,local_1218);
  if (local_1218[0] == '\0') {
    txt = "Max limit on which items?\n\r";
  }
  else {
    bVar2 = is_number(local_1218);
    txt = "You must give the vnum of the object to be maxxed.\n\r";
    if (bVar2) {
      vnum = atoi(local_1218);
      if (vnum != 0) {
        pOVar3 = get_obj_index(vnum);
        if (pOVar3 == (OBJ_INDEX_DATA *)0x0) {
          txt = "No object by that vnum exists.\n\r";
        }
        else {
          sVar1 = pOVar3->limtotal;
          if (sVar1 == 0) {
            txt = "That item is not limited.\n\r";
          }
          else if (pOVar3->limcount < sVar1) {
            pOVar3->limcount = sVar1;
            txt = "Item is now maxxed.\n\r";
          }
          else {
            txt = "That item is already at it\'s max count.\n\r";
          }
        }
      }
    }
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_max_limits(CHAR_DATA *ch, char *argument)
{
	/*
	OBJ_DATA *obj;
	OBJ_DATA *o_next;
	int count;
	*/

	char arg[MAX_INPUT_LENGTH];
	OBJ_INDEX_DATA *pobj;
	int vnum;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Max limit on which items?\n\r", ch);
		return;
	}

	vnum = 0;

	if (is_number(arg))
		vnum = atoi(arg);

	if (vnum != 0)
	{
		pobj = get_obj_index(vnum);

		if (pobj == nullptr)
		{
			send_to_char("No object by that vnum exists.\n\r", ch);
			return;
		}

		if (pobj->limtotal == 0)
		{
			send_to_char("That item is not limited.\n\r", ch);
			return;
		}

		/*
		count = 0;
		for (obj = object_list; obj != nullptr; obj = o_next)
		{
			o_next = obj->next;
			if (obj->pIndexData->vnum == pobj->vnum)
				count++;
		}
		*/

		if (pobj->limcount >= pobj->limtotal)
		{
			send_to_char("That item is already at it's max count.\n\r", ch);
			return;
		}

		pobj->limcount = pobj->limtotal;
		send_to_char("Item is now maxxed.\n\r", ch);
		return;
	}
	else
	{
		send_to_char("You must give the vnum of the object to be maxxed.\n\r", ch);
		return;
	}
}